

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_handler.hpp
# Opt level: O1

void __thiscall
asio::detail::
binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_std::error_code>
::operator()(binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_std::error_code>
             *this)

{
  BrokerBase *this_00;
  activeProtector *paVar1;
  handle timeProtector;
  unique_lock<std::mutex> local_e8;
  undefined1 local_d8 [26];
  byte local_be;
  
  this_00 = (this->handler_).this;
  paVar1 = (this->handler_).active;
  local_e8._M_device = (mutex_type *)&paVar1->m_mutex;
  local_e8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_e8);
  local_e8._M_owns = true;
  if ((paVar1->m_obj).first == true) {
    std::error_code::error_code<asio::error::basic_errors,void>
              ((error_code *)local_d8,operation_aborted);
    if (((this->arg1_)._M_cat == (error_category *)local_d8._8_8_) &&
       ((this->arg1_)._M_value == local_d8._0_4_)) {
      helics::ActionMessage::ActionMessage((ActionMessage *)local_d8,cmd_tick);
      local_be = local_be | 0x10;
      helics::BrokerBase::addActionMessage(this_00,(ActionMessage *)local_d8);
    }
    else {
      helics::ActionMessage::ActionMessage((ActionMessage *)local_d8,cmd_tick);
      helics::BrokerBase::addActionMessage(this_00,(ActionMessage *)local_d8);
    }
    helics::ActionMessage::~ActionMessage((ActionMessage *)local_d8);
  }
  (paVar1->m_obj).second = false;
  std::unique_lock<std::mutex>::~unique_lock(&local_e8);
  return;
}

Assistant:

void operator()()
  {
    static_cast<Handler&&>(handler_)(
        static_cast<const Arg1&>(arg1_));
  }